

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void Unserialize<DataStream,uint256,std::less<uint256>,std::allocator<uint256>>
               (DataStream *is,set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *m)

{
  long lVar1;
  uint uVar2;
  uint64_t uVar3;
  iterator __position;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *in_RSI;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *in_RDI;
  long in_FS_OFFSET;
  uint i;
  uint nSize;
  iterator it;
  uint256 key;
  undefined4 in_stack_ffffffffffffffa8;
  uint uVar4;
  undefined4 in_stack_ffffffffffffffac;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>::clear
            ((set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)
             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  uVar3 = ReadCompactSize<DataStream>
                    ((DataStream *)key.super_base_blob<256U>.m_data._M_elems._8_8_,
                     (bool)key.super_base_blob<256U>.m_data._M_elems[7]);
  uVar2 = (uint)uVar3;
  __position = std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>::begin(in_RSI);
  for (uVar4 = 0; uVar4 < uVar2; uVar4 = uVar4 + 1) {
    uint256::uint256((uint256 *)CONCAT44(uVar2,uVar4));
    Unserialize<DataStream,_uint256_&>((DataStream *)CONCAT44(uVar2,uVar4),(uint256 *)0xdfbeb5);
    __position = std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>::insert
                           (in_RDI,__position._M_node,(value_type *)in_RSI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unserialize(Stream& is, std::set<K, Pred, A>& m)
{
    m.clear();
    unsigned int nSize = ReadCompactSize(is);
    typename std::set<K, Pred, A>::iterator it = m.begin();
    for (unsigned int i = 0; i < nSize; i++)
    {
        K key;
        Unserialize(is, key);
        it = m.insert(it, key);
    }
}